

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::DoRecursiveVMAPAssignment
          (LWOImporter *this,VMapEntry *base,uint numRead,uint idx,float *data)

{
  value_type vVar1;
  size_type sVar2;
  DeadlyImportError *this_00;
  reference pvVar3;
  reference pvVar4;
  reference local_80;
  undefined1 local_6d;
  allocator local_59;
  string local_58;
  uint local_34;
  ReferrerList *pRStack_30;
  uint i;
  ReferrerList *refList;
  float *data_local;
  uint idx_local;
  uint numRead_local;
  VMapEntry *base_local;
  LWOImporter *this_local;
  
  refList = (ReferrerList *)data;
  data_local._0_4_ = idx;
  data_local._4_4_ = numRead;
  _idx_local = base;
  base_local = (VMapEntry *)this;
  if (data == (float *)0x0) {
    __assert_fail("__null != data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOLoader.cpp"
                  ,0x3bf,
                  "void Assimp::LWOImporter::DoRecursiveVMAPAssignment(VMapEntry *, unsigned int, unsigned int, float *)"
                 );
  }
  pRStack_30 = &this->mCurLayer->mPointReferrers;
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size(&base->abAssigned);
  if (sVar2 <= idx) {
    local_6d = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"Bad index",&local_59);
    DeadlyImportError::DeadlyImportError(this_00,&local_58);
    local_6d = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&_idx_local->abAssigned,(ulong)(uint)data_local);
  std::_Bit_reference::operator=(&local_80,true);
  for (local_34 = 0; local_34 < data_local._4_4_; local_34 = local_34 + 1) {
    vVar1 = *(value_type *)
             ((long)&(refList->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start + (ulong)local_34 * 4);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&_idx_local->rawData,(ulong)((uint)data_local * _idx_local->dims + local_34)
                       );
    *pvVar3 = vVar1;
  }
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (pRStack_30,(ulong)(uint)data_local);
  local_34 = *pvVar4;
  if (local_34 != 0xffffffff) {
    DoRecursiveVMAPAssignment(this,_idx_local,data_local._4_4_,local_34,(float *)refList);
  }
  return;
}

Assistant:

inline void LWOImporter::DoRecursiveVMAPAssignment(VMapEntry* base, unsigned int numRead,
    unsigned int idx, float* data)
{
    ai_assert(NULL != data);
    LWO::ReferrerList& refList  = mCurLayer->mPointReferrers;
    unsigned int i;

    if (idx >= base->abAssigned.size()) {
        throw DeadlyImportError("Bad index");
    }
    base->abAssigned[idx] = true;
    for (i = 0; i < numRead;++i) {
        base->rawData[idx*base->dims+i]= data[i];
    }

    if (UINT_MAX != (i = refList[idx])) {
        DoRecursiveVMAPAssignment(base,numRead,i,data);
    }
}